

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * __thiscall LowererMD::EnsureAdjacentArgs(LowererMD *this,Instr *instrArg)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  Opnd *this_00;
  
  this_00 = instrArg->m_src2;
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1982,"(opnd)","opnd");
    if (!bVar3) goto LAB_0065f81c;
    *puVar5 = 0;
  }
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 == OpndKindSym) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar6 = instrArg;
    do {
      OVar4 = IR::Opnd::GetKind(this_00);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_0065f81c;
        *puVar5 = 0;
      }
      pp_Var1 = this_00[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar3) goto LAB_0065f81c;
        *puVar5 = 0;
      }
      instrArg = (Instr *)pp_Var1[5];
      if (instrArg == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1987,"(instrNextArg)","instrNextArg");
        if (!bVar3) goto LAB_0065f81c;
        *puVar5 = 0;
      }
      IR::Instr::SinkInstrBefore(instrArg,pIVar6);
      this_00 = instrArg->m_src2;
      OVar4 = IR::Opnd::GetKind(this_00);
      pIVar6 = instrArg;
    } while (OVar4 == OpndKindSym);
  }
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0065f81c;
    *puVar5 = 0;
  }
  pIVar6 = (Instr *)this_00[1]._vptr_Opnd[5];
  if ((pIVar6 == (Instr *)0x0) || (pIVar6->m_opcode != StartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x198e,"(instrNextArg && instrNextArg->m_opcode == Js::OpCode::StartCall)",
                       "instrNextArg && instrNextArg->m_opcode == Js::OpCode::StartCall");
    if (!bVar3) {
LAB_0065f81c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (pIVar6->m_next != instrArg) {
    IR::Instr::UnlinkStartCallFromBailOutInfo(pIVar6,instrArg);
    IR::Instr::Unlink(pIVar6);
    IR::Instr::InsertBefore(instrArg,pIVar6);
  }
  return pIVar6->m_prev;
}

Assistant:

IR::Instr *
LowererMD::EnsureAdjacentArgs(IR::Instr * instrArg)
{
    // Ensure that the arg instructions for a given call site are adjacent.
    // This isn't normally desirable for CQ, but it's required by, for instance, the cloner,
    // which must clone a complete call sequence.
    IR::Opnd * opnd = instrArg->GetSrc2();
    IR::Instr * instrNextArg;
    StackSym * sym;

    AssertMsg(opnd, "opnd");
    while (opnd->IsSymOpnd())
    {
        sym = opnd->AsSymOpnd()->m_sym->AsStackSym();
        instrNextArg = sym->m_instrDef;
        Assert(instrNextArg);
        instrNextArg->SinkInstrBefore(instrArg);
        instrArg = instrNextArg;
        opnd = instrArg->GetSrc2();
    }
    sym = opnd->AsRegOpnd()->m_sym;
    instrNextArg = sym->m_instrDef;
    Assert(instrNextArg && instrNextArg->m_opcode == Js::OpCode::StartCall);

    // The StartCall can be trivially moved down.
    if (instrNextArg->m_next != instrArg)
    {
        instrNextArg->UnlinkStartCallFromBailOutInfo(instrArg);
        instrNextArg->Unlink();
        instrArg->InsertBefore(instrNextArg);
    }

    return instrNextArg->m_prev;
}